

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorDebug.cpp
# Opt level: O0

void debugReportMarkSingC
               (HighsInt call_id,HighsInt highs_debug_level,HighsLogOptions *log_options,
               HighsInt num_row,vector<int,_std::allocator<int>_> *iwork,HighsInt *basic_index)

{
  uint *puVar1;
  int in_ECX;
  HighsLogOptions *in_RDX;
  int in_ESI;
  int in_EDI;
  vector<int,_std::allocator<int>_> *in_R8;
  long in_R9;
  HighsInt i_4;
  HighsInt i_3;
  HighsInt i_2;
  HighsInt i_1;
  HighsInt i;
  int local_3c;
  uint local_38;
  int local_34;
  int local_30;
  uint local_2c;
  
  if ((in_ESI != 0) && (in_ECX < 0x7c)) {
    if (in_EDI == 0) {
      highsLogDev(in_RDX,kWarning,"\nMarkSingC1");
      highsLogDev(in_RDX,kWarning,"\nIndex  ");
      for (local_2c = 0; (int)local_2c < in_ECX; local_2c = local_2c + 1) {
        highsLogDev(in_RDX,kWarning," %2d",(ulong)local_2c);
      }
      highsLogDev(in_RDX,kWarning,"\niwork  ");
      for (local_30 = 0; local_30 < in_ECX; local_30 = local_30 + 1) {
        puVar1 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](in_R8,(long)local_30);
        highsLogDev(in_RDX,kWarning," %2d",(ulong)*puVar1);
      }
      highsLogDev(in_RDX,kWarning,"\nBaseI  ");
      for (local_34 = 0; local_34 < in_ECX; local_34 = local_34 + 1) {
        highsLogDev(in_RDX,kWarning," %2d",(ulong)*(uint *)(in_R9 + (long)local_34 * 4));
      }
    }
    else if (in_EDI == 1) {
      highsLogDev(in_RDX,kWarning,"\nMarkSingC2");
      highsLogDev(in_RDX,kWarning,"\nIndex  ");
      for (local_38 = 0; (int)local_38 < in_ECX; local_38 = local_38 + 1) {
        highsLogDev(in_RDX,kWarning," %2d",(ulong)local_38);
      }
      highsLogDev(in_RDX,kWarning,"\nNwBaseI");
      for (local_3c = 0; local_3c < in_ECX; local_3c = local_3c + 1) {
        highsLogDev(in_RDX,kWarning," %2d",(ulong)*(uint *)(in_R9 + (long)local_3c * 4));
      }
      highsLogDev(in_RDX,kWarning,"\n");
    }
  }
  return;
}

Assistant:

void debugReportMarkSingC(const HighsInt call_id,
                          const HighsInt highs_debug_level,
                          const HighsLogOptions& log_options,
                          const HighsInt num_row, const vector<HighsInt>& iwork,
                          const HighsInt* basic_index) {
  if (highs_debug_level == kHighsDebugLevelNone) return;
  if (num_row > 123) return;
  if (call_id == 0) {
    highsLogDev(log_options, HighsLogType::kWarning, "\nMarkSingC1");
    highsLogDev(log_options, HighsLogType::kWarning, "\nIndex  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\niwork  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  iwork[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\nBaseI  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  basic_index[i]);
  } else if (call_id == 1) {
    highsLogDev(log_options, HighsLogType::kWarning, "\nMarkSingC2");
    highsLogDev(log_options, HighsLogType::kWarning, "\nIndex  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\nNwBaseI");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  basic_index[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\n");
  }
}